

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall
Js::StepController::EndRecordingCall
          (StepController *this,Var returnValue,JavascriptFunction *function)

{
  bool bVar1;
  ThreadContext *this_00;
  DebugManager *this_01;
  bool isStepOut;
  JavascriptFunction *function_local;
  Var returnValue_local;
  StepController *this_local;
  
  bVar1 = IsActive(this);
  if (((bVar1) && (this->pActivatedContext != (ScriptContext *)0x0)) && (returnValue != (Var)0x0)) {
    this_00 = ScriptContext::GetThreadContext(this->pActivatedContext);
    this_01 = ThreadContext::GetDebugManager(this_00);
    bVar1 = DebugManager::IsAtDispatchHalt(this_01);
    if (bVar1) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar1 = true;
    if (this->stepType != STEP_OUT) {
      bVar1 = this->stepType == STEP_DOCUMENT;
    }
    if (((!bVar1) && (this->returnedValueRecordingDepth < 2)) ||
       ((bVar1 && (this->returnedValueRecordingDepth < 1)))) {
      if (this->stepType == STEP_DOCUMENT) {
        JsUtil::
        List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        ClearAndZero(this->returnedValueList);
      }
      AddToReturnedValueContainer(this,returnValue,function,false);
    }
  }
  this->returnedValueRecordingDepth = this->returnedValueRecordingDepth + -1;
  return;
}

Assistant:

void StepController::EndRecordingCall(Js::Var returnValue, Js::JavascriptFunction * function)
    {
        if (IsActive() && this->pActivatedContext != nullptr && returnValue != nullptr)
        {
            if (this->pActivatedContext->GetThreadContext()->GetDebugManager()->IsAtDispatchHalt())
            {
                // OS bug 3050302 - Keeping this FatalError for finding other issues where we can record when we are at break
                Js::Throw::FatalInternalError();
            }
            bool isStepOut = stepType == STEP_OUT || stepType == STEP_DOCUMENT;

            // Record when :
            // If step-out/document : we need to record calls only which are already on the stack, that means the recording-depth is zero or negative.
            // if not step-out (step-in and step-over). only for those, which are called from the current call-site or the ones as if we step-out
            if ((!isStepOut && returnedValueRecordingDepth <= 1) || (isStepOut && returnedValueRecordingDepth <= 0))
            {
                // if we are step_document, we should be removing whatever we have collected so-far,
                // since they belong to the current document which is a library code
                if (stepType == STEP_DOCUMENT)
                {
                    this->returnedValueList->ClearAndZero();
                }

                AddToReturnedValueContainer(returnValue, function, false/*isValueOfReturnStatement*/);
            }
        }
        returnedValueRecordingDepth--;
    }